

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_DETECT_STAIRS(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  loc grid;
  int iVar2;
  int y;
  int iVar3;
  int iVar4;
  char *fmt;
  int iVar5;
  bool bVar6;
  
  iVar3 = (player->grid).x;
  iVar2 = (player->grid).y;
  y = iVar2 - context->y;
  iVar2 = context->y + iVar2;
  iVar4 = iVar3 - context->x;
  iVar3 = context->x + iVar3;
  if (y < 1) {
    y = 0;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  iVar5 = cave->height + -1;
  if (iVar2 < cave->height) {
    iVar5 = iVar2;
  }
  iVar2 = cave->width + -1;
  if (iVar3 < cave->width) {
    iVar2 = iVar3;
  }
  if (y < iVar5) {
    bVar6 = false;
    do {
      iVar3 = iVar4;
      if (iVar4 < iVar2) {
        do {
          grid = (loc)loc(iVar3,y);
          _Var1 = square_in_bounds_fully(cave,grid);
          if ((_Var1) && (_Var1 = square_isstairs(cave,grid), _Var1)) {
            square_memorize(cave,grid);
            square_light_spot((chunk *)cave,grid);
            bVar6 = true;
          }
          iVar3 = iVar3 + 1;
        } while (iVar2 != iVar3);
      }
      y = y + 1;
    } while (y != iVar5);
    if (!bVar6) goto LAB_0013f00b;
    fmt = "You sense the presence of stairs!";
  }
  else {
LAB_0013f00b:
    if (context->aware != true) goto LAB_0013f020;
    fmt = "You sense no stairs.";
  }
  msg(fmt);
LAB_0013f020:
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_STAIRS(effect_handler_context_t *context)
{
	int x, y;
	int x1, x2, y1, y2;

	bool stairs = false;

	/* Pick an area to detect */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Detect stairs */
			if (square_isstairs(cave, grid)) {
				/* Memorize */
				square_memorize(cave, grid);
				square_light_spot(cave, grid);

				/* Obvious */
				stairs = true;
			}
		}
	}

	/* Describe */
	if (stairs)
		msg("You sense the presence of stairs!");
	else if (context->aware)
		msg("You sense no stairs.");

	context->ident = true;
	return true;
}